

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O2

int Abc_NtkRemoveSelfFeedLatches(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pFaninNew;
  int i;
  int iVar3;
  
  iVar3 = 0;
  for (i = 0; i < pNtk->vBoxes->nSize; i = i + 1) {
    pAVar2 = Abc_NtkBox(pNtk,i);
    if ((*(uint *)&pAVar2->field_0x14 & 0xf) == 8) {
      iVar1 = Abc_NtkLatchIsSelfFeed(pAVar2);
      if (iVar1 != 0) {
        if (pNtk->ntkType == ABC_NTK_STRASH) {
          pFaninNew = Abc_AigConst1(pNtk);
        }
        else {
          pFaninNew = Abc_NtkCreateNodeConst1(pNtk);
        }
        pAVar2 = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray];
        Abc_ObjPatchFanin(pAVar2,(Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray]
                          ,pFaninNew);
        iVar3 = iVar3 + 1;
      }
    }
  }
  return iVar3;
}

Assistant:

int Abc_NtkRemoveSelfFeedLatches( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pLatch, * pConst1;
    int i, Counter;
    Counter = 0;
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        if ( Abc_NtkLatchIsSelfFeed( pLatch ) )
        {
            if ( Abc_NtkIsStrash(pNtk) )
                pConst1 = Abc_AigConst1(pNtk);
            else
                pConst1 = Abc_NtkCreateNodeConst1(pNtk);
            Abc_ObjPatchFanin( Abc_ObjFanin0(pLatch), Abc_ObjFanin0(Abc_ObjFanin0(pLatch)), pConst1 );
            Counter++;
        }
    }
    return Counter;
}